

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O2

string * __thiscall
cmLinkLineComputer::ComputeLinkLibs_abi_cxx11_
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli)

{
  TargetType TVar1;
  ItemVector *pIVar2;
  pointer pIVar3;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pIVar2 = cmComputeLinkInformation::GetItems(cli);
  pIVar3 = (pIVar2->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pIVar3 == (pIVar2->
                  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      return __return_storage_ptr__;
    }
    if (pIVar3->Target == (cmGeneratorTarget *)0x0) {
LAB_002fb6a6:
      if (pIVar3->IsPath == true) {
        (*this->_vptr_cmLinkLineComputer[2])(&local_70,this,pIVar3);
        ConvertToOutputFormat(&local_50,this,&local_70);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      TVar1 = cmGeneratorTarget::GetType(pIVar3->Target);
      if (TVar1 != INTERFACE_LIBRARY) goto LAB_002fb6a6;
    }
    pIVar3 = pIVar3 + 1;
  } while( true );
}

Assistant:

std::string cmLinkLineComputer::ComputeLinkLibs(cmComputeLinkInformation& cli)
{
  std::string linkLibs;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  for (ItemVector::const_iterator li = items.begin(); li != items.end();
       ++li) {
    if (li->Target &&
        li->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    if (li->IsPath) {
      linkLibs +=
        this->ConvertToOutputFormat(this->ConvertToLinkReference(li->Value));
    } else {
      linkLibs += li->Value;
    }
    linkLibs += " ";
  }
  return linkLibs;
}